

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidArgsortWrongAxis(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  Arena *pAVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *pAVar6;
  NeuralNetwork *this;
  NeuralNetworkLayer *this_00;
  Tensor *this_01;
  string *psVar7;
  long lVar8;
  ostream *poVar9;
  Result local_110;
  undefined4 local_e4;
  undefined1 local_e0 [8];
  Result res;
  ArgSortLayerParams *params;
  NeuralNetworkLayer *layers;
  NeuralNetwork *nn;
  ArrayFeatureType *outShape;
  FeatureDescription *out;
  ArrayFeatureType *inShape;
  FeatureDescription *in;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&in);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in);
  pFVar3 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar3->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar3->name_,"input",pAVar4);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar6 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,2);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in);
  pFVar3 = CoreML::Specification::ModelDescription::add_output(pMVar2);
  pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar3->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar3->name_,"output",pAVar4);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar6 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,2);
  this = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&in);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(this,EXACT_ARRAY_MAPPING);
  this_00 = CoreML::Specification::NeuralNetwork::add_layers(this);
  pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&this_00->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&this_00->name_,"argsort",pAVar4);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  this_01 = CoreML::Specification::NeuralNetworkLayer::add_inputtensor(this_00);
  CoreML::Specification::Tensor::set_rank(this_01,3);
  res.m_message.field_2._8_8_ = CoreML::Specification::NeuralNetworkLayer::mutable_argsort(this_00);
  CoreML::Specification::ArgSortLayerParams::set_axis
            ((ArgSortLayerParams *)res.m_message.field_2._8_8_,-1);
  CoreML::validate<(MLModelType)500>((Result *)local_e0,(Model *)&in);
  bVar1 = CoreML::Result::good((Result *)local_e0);
  if (bVar1) {
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1757);
    poVar9 = std::operator<<(poVar9,": error: ");
    poVar9 = std::operator<<(poVar9,"!((res).good())");
    poVar9 = std::operator<<(poVar9," was false, expected true.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    m._oneof_case_[0] = 1;
  }
  else {
    psVar7 = CoreML::Result::message_abi_cxx11_((Result *)local_e0);
    lVar8 = std::__cxx11::string::find((char *)psVar7,0x553c7c);
    if (lVar8 == -1) {
      poVar9 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar9 = std::operator<<(poVar9,":");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1758);
      poVar9 = std::operator<<(poVar9,": error: ");
      poVar9 = std::operator<<(poVar9,"res.message().find(\"axis\") != std::string::npos");
      poVar9 = std::operator<<(poVar9," was false, expected true.");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      m._oneof_case_[0] = 1;
    }
    else {
      CoreML::Specification::ArgSortLayerParams::set_axis
                ((ArgSortLayerParams *)res.m_message.field_2._8_8_,3);
      CoreML::validate<(MLModelType)500>(&local_110,(Model *)&in);
      CoreML::Result::operator=((Result *)local_e0,&local_110);
      CoreML::Result::~Result(&local_110);
      bVar1 = CoreML::Result::good((Result *)local_e0);
      if (bVar1) {
        poVar9 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                );
        poVar9 = std::operator<<(poVar9,":");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x175d);
        poVar9 = std::operator<<(poVar9,": error: ");
        poVar9 = std::operator<<(poVar9,"!((res).good())");
        poVar9 = std::operator<<(poVar9," was false, expected true.");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        m._oneof_case_[0] = 1;
      }
      else {
        psVar7 = CoreML::Result::message_abi_cxx11_((Result *)local_e0);
        lVar8 = std::__cxx11::string::find((char *)psVar7,0x553c7c);
        if (lVar8 == -1) {
          poVar9 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                  );
          poVar9 = std::operator<<(poVar9,":");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x175e);
          poVar9 = std::operator<<(poVar9,": error: ");
          poVar9 = std::operator<<(poVar9,"res.message().find(\"axis\") != std::string::npos");
          poVar9 = std::operator<<(poVar9," was false, expected true.");
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          m._oneof_case_[0] = 1;
        }
        else {
          m._oneof_case_[0] = 0;
        }
      }
    }
  }
  local_e4 = 1;
  CoreML::Result::~Result((Result *)local_e0);
  CoreML::Specification::Model::~Model((Model *)&in);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidArgsortWrongAxis() {

    // axis can't be negative or larger than equal to input rank

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->set_name("argsort");
    layers->add_input("input");
    layers->add_output("output");
    layers->add_inputtensor()->set_rank(3);

    auto *params = layers->mutable_argsort();

    // CASE 1: negative axis
    params->set_axis(-1);

    // axis should be in range [0, rank)
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("axis") != std::string::npos);

    // CASE 2: axis greater than equal to input rank
    params->set_axis(3);
    res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("axis") != std::string::npos);

    return 0;
}